

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.h
# Opt level: O0

void leveldb::EncodeFixed32(char *dst,uint32_t value)

{
  uint8_t *buffer;
  uint32_t value_local;
  char *dst_local;
  
  *dst = (char)value;
  dst[1] = (char)(value >> 8);
  dst[2] = (char)(value >> 0x10);
  dst[3] = (char)(value >> 0x18);
  return;
}

Assistant:

inline void EncodeFixed32(char* dst, uint32_t value) {
  uint8_t* const buffer = reinterpret_cast<uint8_t*>(dst);

  // Recent clang and gcc optimize this to a single mov / str instruction.
  buffer[0] = static_cast<uint8_t>(value);
  buffer[1] = static_cast<uint8_t>(value >> 8);
  buffer[2] = static_cast<uint8_t>(value >> 16);
  buffer[3] = static_cast<uint8_t>(value >> 24);
}